

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

InputMap * __thiscall Omega_h::InputMap::get_map(InputMap *this,string *name)

{
  bool bVar1;
  InputMap *pIVar2;
  shared_ptr<Omega_h::Input> sptr;
  
  bVar1 = is_input<Omega_h::InputMap>(this,name);
  if (!bVar1) {
    pIVar2 = (InputMap *)operator_new(0x48);
    (pIVar2->super_Input)._vptr_Input = (_func_int **)0x0;
    (pIVar2->super_Input).parent = (Input *)0x0;
    *(undefined8 *)&(pIVar2->super_Input).used = 0;
    *(undefined8 *)&(pIVar2->map)._M_t._M_impl = 0;
    *(undefined8 *)&(pIVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (pIVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pIVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (pIVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (pIVar2->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    InputMap(pIVar2);
    std::__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::InputMap,void>
              ((__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2> *)&sptr,pIVar2);
    add(this,name,&sptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pIVar2 = use_input<Omega_h::InputMap>(this,name);
  return pIVar2;
}

Assistant:

InputMap& InputMap::get_map(std::string const& name) {
  if (!is_map(name)) {
    std::shared_ptr<Input> sptr(new InputMap());
    this->add(name, std::move(sptr));
  }
  return this->use_input<InputMap>(name);
}